

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_NotifyCompletion
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle,char *uploadCorrelationId,_Bool isSuccess,
          int responseCode,char *responseMessage)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  STRING_HANDLE handle_00;
  size_t size;
  BUFFER_HANDLE handle_01;
  uchar *source;
  STRING_HANDLE handle_02;
  HTTPAPIEX_HANDLE http_api_handle;
  HTTP_HEADERS_HANDLE request_header;
  undefined4 in_register_0000000c;
  IOTHUB_CLIENT_RESULT IVar4;
  
  if (handle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0 || uploadCorrelationId == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_NotifyCompletion",0x424,1,
                "invalid argument detected handle=%p uploadCorrelationId=%p",handle,
                uploadCorrelationId);
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    return IOTHUB_CLIENT_INVALID_ARG;
  }
  pcVar3 = "false";
  if (isSuccess) {
    pcVar3 = "true";
  }
  handle_00 = STRING_construct_sprintf
                        ("{\"correlationId\":\"%s\", \"isSuccess\":%s, \"statusCode\":%d, \"statusDescription\":\"%s\"}"
                         ,uploadCorrelationId,pcVar3,CONCAT44(in_register_0000000c,responseCode));
  if (handle_00 == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
              ,"IoTHubClient_LL_UploadToBlob_NotifyCompletion",0x433,1,
              "STRING_construct_sprintf failed");
    return IOTHUB_CLIENT_ERROR;
  }
  size = STRING_length(handle_00);
  handle_01 = BUFFER_new();
  if (handle_01 == (BUFFER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    IVar4 = IOTHUB_CLIENT_ERROR;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_NotifyCompletion",0x43d,1,"BUFFER_new failed");
    }
    goto LAB_0012986e;
  }
  source = (uchar *)STRING_c_str(handle_00);
  iVar1 = BUFFER_build(handle_01,source,size);
  if (iVar1 == 0) {
    handle_02 = STRING_construct_sprintf
                          ("/devices/%s/files/notifications/%s",handle->deviceId,
                           "?api-version=2016-11-14");
    if (handle_02 == (STRING_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion",0x273,1,
                  "Failure constructing relative path string");
      }
    }
    else {
      http_api_handle = createIotHubHttpApiExHandle(handle);
      if (http_api_handle == (HTTPAPIEX_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion",0x27c,1,
                    "Failed to create the HTTPAPIEX_HANDLE for Azure IoT Hub");
        }
      }
      else {
        request_header = createIotHubRequestHttpHeaders(handle);
        if (request_header == (HTTP_HEADERS_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion",0x285,1,
                      "Failed to allocate HTTP headers for IoT Hub connection");
          }
        }
        else {
          if (handle->cred_type - IOTHUB_CREDENTIAL_TYPE_X509 < 4) {
            pcVar3 = STRING_c_str(handle_02);
            iVar1 = send_http_request(http_api_handle,pcVar3,request_header,handle_01,
                                      (BUFFER_HANDLE)0x0);
            if (iVar1 == 0) {
LAB_001297c2:
              HTTPHeaders_Free(request_header);
              HTTPAPIEX_Destroy(http_api_handle);
              STRING_delete(handle_02);
              IVar4 = IOTHUB_CLIENT_OK;
              goto LAB_00129866;
            }
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar3 = "unable to execute send_http_request";
              iVar1 = 0x299;
              goto LAB_0012980a;
            }
          }
          else if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) {
            pcVar3 = STRING_c_str(handle_02);
            iVar1 = send_http_sas_request
                              (handle,http_api_handle,pcVar3,request_header,handle_01,
                               (BUFFER_HANDLE)0x0);
            if (iVar1 == 0) goto LAB_001297c2;
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar3 = "unable to execute send_http_sas_request";
              iVar1 = 0x2a6;
              goto LAB_0012980a;
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              pcVar3 = "internal error: unknown authorization Scheme";
              iVar1 = 0x28e;
LAB_0012980a:
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                        ,"IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion",iVar1,1,
                        pcVar3);
            }
          }
          HTTPHeaders_Free(request_header);
        }
        HTTPAPIEX_Destroy(http_api_handle);
      }
      STRING_delete(handle_02);
    }
    p_Var2 = xlogging_get_log_function();
    IVar4 = IOTHUB_CLIENT_ERROR;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = "IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion failed";
      iVar1 = 0x446;
      goto LAB_0012985b;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    IVar4 = IOTHUB_CLIENT_ERROR;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = 
      "Unable to BUFFER_build, can\'t perform IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion"
      ;
      iVar1 = 0x450;
LAB_0012985b:
      IVar4 = IOTHUB_CLIENT_ERROR;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_NotifyCompletion",iVar1,1,pcVar3);
    }
  }
LAB_00129866:
  BUFFER_delete(handle_01);
LAB_0012986e:
  STRING_delete(handle_00);
  return IVar4;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_NotifyCompletion(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle, const char* uploadCorrelationId, bool isSuccess, int responseCode, const char* responseMessage)
{
    IOTHUB_CLIENT_RESULT result;

    if (handle == NULL || uploadCorrelationId == NULL)
    {
        LogError("invalid argument detected handle=%p uploadCorrelationId=%p", handle, uploadCorrelationId);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA*)handle;

        STRING_HANDLE response = STRING_construct_sprintf(RESPONSE_BODY_FORMAT,
                                                    uploadCorrelationId,
                                                    isSuccess ? RESPONSE_BODY_SUCCESS_BOOLEAN_STRING : RESPONSE_BODY_ERROR_BOOLEAN_STRING,
                                                    responseCode,
                                                    responseMessage != NULL ? responseMessage : EMPTY_STRING);

        if(response == NULL)
        {
            LogError("STRING_construct_sprintf failed");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            size_t response_length = STRING_length(response);
            BUFFER_HANDLE responseToIoTHub = BUFFER_new();

            if (responseToIoTHub == NULL)
            {
                LogError("BUFFER_new failed");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                if (BUFFER_build(responseToIoTHub, (const unsigned char*)STRING_c_str(response), response_length) == 0)
                {
                    if (IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion(upload_data, responseToIoTHub) != 0)
                    {
                        LogError("IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion failed");
                        result = IOTHUB_CLIENT_ERROR;
                    }
                    else
                    {
                        result = IOTHUB_CLIENT_OK;
                    }
                }
                else
                {
                    LogError("Unable to BUFFER_build, can't perform IoTHubClient_LL_UploadToBlob_NotifyIoTHubOfUploadCompletion");
                    result = IOTHUB_CLIENT_ERROR;
                }

                BUFFER_delete(responseToIoTHub);
            }

            STRING_delete(response);
        }
    }

    return result;
}